

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O1

int __thiscall
sc_core::sc_phash_base::remove_by_contents
          (sc_phash_base *this,_func_bool_void_ptr_void_ptr *predicate,void *arg)

{
  bool bVar1;
  sc_phash_elem *psVar2;
  long lVar3;
  int iVar4;
  sc_phash_elem *p;
  sc_phash_elem **ppsVar5;
  
  if (this->num_bins < 1) {
    iVar4 = 0;
  }
  else {
    lVar3 = 0;
    iVar4 = 0;
    do {
      p = this->bins[lVar3];
      if (p != (sc_phash_elem *)0x0) {
        ppsVar5 = this->bins + lVar3;
        do {
          bVar1 = (*predicate)(p->contents,arg);
          psVar2 = p->next;
          if (bVar1) {
            *ppsVar5 = psVar2;
            sc_mempool::release(p,0x18);
            psVar2 = *ppsVar5;
            this->num_entries = this->num_entries + -1;
            iVar4 = iVar4 + 1;
          }
          else {
            ppsVar5 = &p->next;
          }
          p = psVar2;
        } while (psVar2 != (sc_phash_elem *)0x0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->num_bins);
  }
  return iVar4;
}

Assistant:

int
sc_phash_base::remove_by_contents( bool (*predicate)(const void* c, void* arg), void* arg )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (! (*predicate)(ptr->contents, arg)) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}